

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O3

Reals __thiscall Omega_h::matrices_to_symms_dim<3>(Omega_h *this,Reals *matrices)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  int iVar6;
  size_t sVar7;
  Reals RVar8;
  type functor;
  Write<double> out;
  string local_60;
  Write<double> local_40;
  Write<double> local_30;
  
  pAVar2 = (matrices->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar7 = pAVar2->size;
  }
  else {
    sVar7 = (ulong)pAVar2 >> 3;
  }
  iVar6 = (int)(sVar7 >> 3);
  if (iVar6 * 0x38e38e39 + 0xe38e38eU < 0x1c71c71d) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    iVar6 = iVar6 / 9;
    Write<double>::Write(&local_40,iVar6 * 6,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)local_40.shared_alloc_.alloc;
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60._M_dataplus._M_p = (pointer)((local_40.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.shared_alloc_.alloc)->use_count = (local_40.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60._M_string_length = (size_type)local_40.shared_alloc_.direct_ptr;
    local_60.field_2._M_allocated_capacity = (size_type)(matrices->write_).shared_alloc_.alloc;
    if ((local_60.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_60.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.field_2._M_allocated_capacity =
             ((Alloc *)local_60.field_2._M_allocated_capacity)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_60.field_2._M_allocated_capacity)->use_count =
             ((Alloc *)local_60.field_2._M_allocated_capacity)->use_count + 1;
      }
    }
    local_60.field_2._8_8_ = (matrices->write_).shared_alloc_.direct_ptr;
    parallel_for<Omega_h::matrices_to_symms_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
              (iVar6,(type *)&local_60);
    local_30.shared_alloc_.alloc = local_40.shared_alloc_.alloc;
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_30.shared_alloc_.alloc = (Alloc *)((local_40.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.shared_alloc_.alloc)->use_count = (local_40.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_30.shared_alloc_.direct_ptr = local_40.shared_alloc_.direct_ptr;
    Read<double>::Read((Read<signed_char> *)this,&local_30);
    pAVar2 = local_30.shared_alloc_.alloc;
    pvVar5 = extraout_RDX;
    if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 &&
        local_30.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    uVar4 = local_60.field_2._M_allocated_capacity;
    if ((local_60.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_60.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_60.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_60.field_2._M_allocated_capacity);
        operator_delete((void *)uVar4,0x48);
        pvVar5 = extraout_RDX_01;
      }
    }
    _Var3._M_p = local_60._M_dataplus._M_p;
    if (((ulong)local_60._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_60._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_60._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_60._M_dataplus._M_p);
        operator_delete(_Var3._M_p,0x48);
        pvVar5 = extraout_RDX_02;
      }
    }
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40.shared_alloc_.alloc);
        operator_delete(local_40.shared_alloc_.alloc,0x48);
        pvVar5 = extraout_RDX_03;
      }
    }
    RVar8.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar8.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Reals matrices_to_symms_dim(Reals const matrices) {
  constexpr auto ncomps_in = square(dim);
  constexpr auto ncomps_out = symm_ncomps(dim);
  auto const n = divide_no_remainder(matrices.size(), ncomps_in);
  auto const out = Write<Real>(n * ncomps_out);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    set_symm(out, i, get_matrix<dim, dim>(matrices, i));
  };
  parallel_for(n, std::move(functor));
  return out;
}